

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O0

int numroots(int np,poly *sseq,int *atneg,int *atpos,bool non_neg)

{
  int *piVar1;
  double *pdVar2;
  poly *local_50;
  poly *s;
  double lf;
  double f;
  int local_30;
  int atneginf;
  int atposinf;
  bool non_neg_local;
  int *atpos_local;
  int *atneg_local;
  poly *sseq_local;
  int np_local;
  
  local_30 = 0;
  f._4_4_ = 0;
  s = (poly *)sseq->coef[sseq->ord];
  for (local_50 = sseq + 1; local_50 <= sseq + np; local_50 = local_50 + 1) {
    piVar1 = &local_50->ord;
    pdVar2 = local_50->coef;
    if ((((double)s == 0.0) && (!NAN((double)s))) || ((double)s * pdVar2[*piVar1] < 0.0)) {
      local_30 = local_30 + 1;
    }
    s = (poly *)pdVar2[*piVar1];
  }
  if (non_neg) {
    f._4_4_ = numchanges(np,sseq,0.0);
  }
  else {
    if ((sseq->ord & 1U) == 0) {
      s = (poly *)sseq->coef[sseq->ord];
    }
    else {
      s = (poly *)((ulong)sseq->coef[sseq->ord] ^ 0x8000000000000000);
    }
    for (local_50 = sseq + 1; local_50 <= sseq + np; local_50 = local_50 + 1) {
      if ((local_50->ord & 1U) == 0) {
        lf = local_50->coef[local_50->ord];
      }
      else {
        lf = -local_50->coef[local_50->ord];
      }
      if ((((double)s == 0.0) && (!NAN((double)s))) || ((double)s * lf < 0.0)) {
        f._4_4_ = f._4_4_ + 1;
      }
      s = (poly *)lf;
    }
  }
  *atneg = f._4_4_;
  *atpos = local_30;
  return f._4_4_ - local_30;
}

Assistant:

int numroots(int np, poly *sseq, int *atneg, int *atpos, bool non_neg)
{
	int atposinf = 0;
	int atneginf = 0;

	/* changes at positive infinity */
	double f;
	double lf = sseq[0].coef[sseq[0].ord];

	poly *s;
	for (s = sseq + 1; s <= sseq + np; s++) {
		f = s->coef[s->ord];
		if (lf == 0.0 || lf * f < 0)
			atposinf++;
		lf = f;
	}

	// changes at negative infinity or zero
	if (non_neg)
		atneginf = numchanges(np, sseq, 0.0);

	else
	{
		if (sseq[0].ord & 1)
			lf = -sseq[0].coef[sseq[0].ord];
		else
			lf = sseq[0].coef[sseq[0].ord];

		for (s = sseq + 1; s <= sseq + np; s++) {
			if (s->ord & 1)
				f = -s->coef[s->ord];
			else
				f = s->coef[s->ord];
			if (lf == 0.0 || lf * f < 0)
				atneginf++;
			lf = f;
		}
	}

	*atneg = atneginf;
	*atpos = atposinf;

	return(atneginf - atposinf);
}